

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O3

void * lj_alloc_malloc(void *msp,size_t nsize)

{
  ulong *puVar1;
  byte *pbVar2;
  void *pvVar3;
  undefined1 (*pauVar4) [16];
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  long lVar9;
  void *pvVar10;
  undefined1 (*pauVar11) [16];
  long lVar12;
  undefined1 (*pauVar13) [16];
  ulong uVar14;
  size_t dvs;
  undefined1 (*pauVar15) [16];
  ulong uVar16;
  undefined8 *puVar17;
  uint uVar18;
  long lVar19;
  uint uVar20;
  ulong *puVar21;
  ulong uVar22;
  long lVar23;
  long *plVar24;
  byte bVar25;
  ulong uVar26;
  long lVar27;
  undefined8 *puVar28;
  long lVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  
  if (nsize < 0xf1) {
    uVar14 = 0x20;
    if (0x16 < nsize) {
      uVar14 = (ulong)((int)nsize + 0xfU & 0x1f8);
    }
    uVar18 = *msp;
    bVar25 = (byte)(uVar14 >> 3);
    uVar20 = uVar18 >> (bVar25 & 0x1f);
    if ((uVar20 & 3) != 0) {
      uVar20 = (~uVar20 & 1) + (int)(uVar14 >> 3);
      lVar9 = (long)msp + (ulong)(uVar20 * 0x10) + 0x38;
      lVar12 = *(long *)((long)msp + (ulong)(uVar20 * 0x10) + 0x48);
      lVar23 = *(long *)(lVar12 + 0x10);
      if (lVar9 == lVar23) {
        *(uint *)msp = uVar18 & ~(1 << (uVar20 & 0x1f));
      }
      else {
        *(long *)((long)msp + (ulong)(uVar20 * 0x10) + 0x48) = lVar23;
        *(long *)(lVar23 + 0x18) = lVar9;
      }
      *(ulong *)(lVar12 + 8) = (ulong)(uVar20 * 8) + 3;
      pbVar2 = (byte *)(lVar12 + 8 + (ulong)(uVar20 * 8));
      *pbVar2 = *pbVar2 | 1;
      return (void *)(lVar12 + 0x10);
    }
    uVar16 = *(ulong *)((long)msp + 8);
    if (uVar16 < uVar14) {
      if (uVar18 >> (bVar25 & 0x1f) != 0) {
        uVar8 = 2 << (bVar25 & 0x1f);
        uVar8 = (-uVar8 | uVar8) & uVar20 << (bVar25 & 0x1f);
        uVar20 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
          }
        }
        uVar8 = uVar20 << 4;
        lVar9 = (long)msp + (ulong)uVar8 + 0x38;
        lVar12 = *(long *)((long)msp + (ulong)uVar8 + 0x48);
        lVar23 = *(long *)(lVar12 + 0x10);
        if (lVar9 == lVar23) {
          uVar18 = uVar18 & ~(1 << (uVar20 & 0x1f));
          *(uint *)msp = uVar18;
        }
        else {
          *(long *)((long)msp + (ulong)uVar8 + 0x48) = lVar23;
          *(long *)(lVar23 + 0x18) = lVar9;
        }
        uVar26 = (ulong)(uVar20 * 8);
        uVar22 = uVar26 - uVar14;
        if (0x1f < uVar22) {
          *(ulong *)(lVar12 + 8) = uVar14 | 3;
          *(ulong *)(lVar12 + 8 + uVar14) = uVar22 | 1;
          *(ulong *)(lVar12 + uVar26) = uVar22;
          if (uVar16 != 0) {
            lVar23 = *(long *)((long)msp + 0x18);
            uVar16 = uVar16 >> 3;
            lVar9 = (long)msp + uVar16 * 0x10 + 0x38;
            if ((uVar18 >> ((uint)uVar16 & 0x1f) & 1) == 0) {
              *(uint *)msp = uVar18 | 1 << ((byte)uVar16 & 0x1f);
              lVar27 = lVar9;
            }
            else {
              lVar27 = *(long *)(lVar9 + 0x10);
            }
            *(long *)(lVar9 + 0x10) = lVar23;
            *(long *)(lVar27 + 0x18) = lVar23;
            *(long *)(lVar23 + 0x10) = lVar27;
            *(long *)(lVar23 + 0x18) = lVar9;
          }
          *(ulong *)((long)msp + 8) = uVar22;
          *(ulong *)((long)msp + 0x18) = lVar12 + uVar14;
          return (void *)(lVar12 + 0x10);
        }
        *(ulong *)(lVar12 + 8) = uVar26 | 3;
        pbVar2 = (byte *)(lVar12 + 8 + uVar26);
        *pbVar2 = *pbVar2 | 1;
        return (void *)(lVar12 + 0x10);
      }
      uVar20 = *(uint *)((long)msp + 4);
      if (uVar20 != 0) {
        uVar8 = 0;
        if (uVar20 != 0) {
          for (; (uVar20 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
          }
        }
        lVar12 = *(long *)((long)msp + (ulong)uVar8 * 8 + 0x248);
        uVar22 = (*(ulong *)(lVar12 + 8) & 0xfffffffffffffffc) - uVar14;
        lVar23 = lVar12;
        while ((lVar9 = *(long *)(lVar23 + 0x20), lVar9 != 0 ||
               (lVar9 = *(long *)(lVar23 + 0x28), lVar9 != 0))) {
          uVar26 = (*(ulong *)(lVar9 + 8) & 0xfffffffffffffffc) - uVar14;
          lVar23 = lVar9;
          if (uVar26 < uVar22) {
            lVar12 = lVar9;
            uVar22 = uVar26;
          }
        }
        lVar23 = *(long *)(lVar12 + 0x18);
        lVar9 = *(long *)(lVar12 + 0x30);
        if (lVar23 == lVar12) {
          if (*(long *)(lVar12 + 0x28) == 0) {
            if (*(long *)(lVar12 + 0x20) == 0) {
              lVar23 = 0;
              goto LAB_0012c4f7;
            }
            lVar27 = *(long *)(lVar12 + 0x20);
            puVar17 = (undefined8 *)(lVar12 + 0x20);
          }
          else {
            lVar27 = *(long *)(lVar12 + 0x28);
            puVar17 = (undefined8 *)(lVar12 + 0x28);
          }
          do {
            do {
              puVar28 = puVar17;
              lVar23 = lVar27;
              lVar27 = *(long *)(lVar23 + 0x28);
              puVar17 = (undefined8 *)(lVar23 + 0x28);
            } while (*(long *)(lVar23 + 0x28) != 0);
            lVar27 = *(long *)(lVar23 + 0x20);
            puVar17 = (undefined8 *)(lVar23 + 0x20);
          } while (*(long *)(lVar23 + 0x20) != 0);
          *puVar28 = 0;
        }
        else {
          lVar27 = *(long *)(lVar12 + 0x10);
          *(long *)(lVar27 + 0x18) = lVar23;
          *(long *)(lVar23 + 0x10) = lVar27;
        }
LAB_0012c4f7:
        if (lVar9 != 0) {
          lVar27 = *(long *)(lVar12 + 0x38);
          if (lVar12 == *(long *)((long)msp + lVar27 * 8 + 0x248)) {
            *(long *)((long)msp + lVar27 * 8 + 0x248) = lVar23;
            if (lVar23 != 0) goto LAB_0012c52c;
            *(uint *)((long)msp + 4) = uVar20 & ~(1 << ((uint)lVar27 & 0x1f));
          }
          else {
            *(long *)(lVar9 + 0x20 + (ulong)(*(long *)(lVar9 + 0x20) != lVar12) * 8) = lVar23;
            if (lVar23 != 0) {
LAB_0012c52c:
              *(long *)(lVar23 + 0x30) = lVar9;
              lVar9 = *(long *)(lVar12 + 0x20);
              if (lVar9 != 0) {
                *(long *)(lVar23 + 0x20) = lVar9;
                *(long *)(lVar9 + 0x30) = lVar23;
              }
              lVar9 = *(long *)(lVar12 + 0x28);
              if (lVar9 != 0) {
                *(long *)(lVar23 + 0x28) = lVar9;
                *(long *)(lVar9 + 0x30) = lVar23;
              }
            }
          }
        }
        if (uVar22 < 0x20) {
          *(ulong *)(lVar12 + 8) = uVar22 + uVar14 | 3;
          pbVar2 = (byte *)(lVar12 + 8 + uVar22 + uVar14);
          *pbVar2 = *pbVar2 | 1;
        }
        else {
          *(ulong *)(lVar12 + 8) = uVar14 | 3;
          *(ulong *)(lVar12 + 8 + uVar14) = uVar22 | 1;
          *(ulong *)(lVar12 + uVar14 + uVar22) = uVar22;
          if (uVar16 != 0) {
            lVar23 = *(long *)((long)msp + 0x18);
            uVar16 = uVar16 >> 3;
            lVar9 = (long)msp + uVar16 * 0x10 + 0x38;
            if ((uVar18 >> ((uint)uVar16 & 0x1f) & 1) == 0) {
              *(uint *)msp = 1 << ((byte)uVar16 & 0x1f) | uVar18;
              lVar27 = lVar9;
            }
            else {
              lVar27 = *(long *)((long)msp + uVar16 * 0x10 + 0x48);
            }
            *(long *)((long)msp + uVar16 * 0x10 + 0x48) = lVar23;
            *(long *)(lVar27 + 0x18) = lVar23;
            *(long *)(lVar23 + 0x10) = lVar27;
            *(long *)(lVar23 + 0x18) = lVar9;
          }
          *(ulong *)((long)msp + 8) = uVar22;
          *(ulong *)((long)msp + 0x18) = lVar12 + uVar14;
        }
        goto LAB_0012bd42;
      }
    }
  }
  else {
    uVar14 = 0xffffffffffffffff;
    if (nsize < 0xffffffffffffff80) {
      uVar14 = nsize + 0xf & 0xfffffffffffffff8;
      uVar18 = *(uint *)((long)msp + 4);
      if (uVar18 != 0) {
        uVar20 = (uint)(nsize + 0xf >> 8);
        if (uVar20 == 0) {
          uVar16 = 0;
        }
        else {
          uVar16 = 0x1f;
          if (uVar20 < 0x10000) {
            uVar8 = 0x1f;
            if (uVar20 != 0) {
              for (; uVar20 >> uVar8 == 0; uVar8 = uVar8 - 1) {
              }
            }
            uVar16 = (ulong)((uVar14 >> ((ulong)(byte)(0x26 - (char)(uVar8 ^ 0x1f)) & 0x3f) & 1) !=
                            0) | (ulong)((uVar8 ^ 0x1f) * 2 ^ 0x3e);
          }
        }
        uVar22 = -uVar14;
        lVar12 = *(long *)((long)msp + uVar16 * 8 + 0x248);
        if (lVar12 == 0) {
          lVar23 = 0;
          lVar9 = 0;
        }
        else {
          bVar25 = 0x39 - (char)(uVar16 >> 1);
          if (uVar16 == 0x1f) {
            bVar25 = 0;
          }
          lVar27 = uVar14 << (bVar25 & 0x3f);
          lVar23 = 0;
          lVar9 = 0;
          do {
            uVar26 = (*(ulong *)(lVar12 + 8) & 0xfffffffffffffffc) - uVar14;
            if ((uVar26 < uVar22) && (lVar9 = lVar12, uVar22 = uVar26, uVar26 == 0)) {
              uVar22 = 0;
              goto LAB_0012bbf8;
            }
            lVar19 = *(long *)(lVar12 + 0x28);
            lVar12 = *(long *)(lVar12 + 0x20 + (lVar27 >> 0x3f) * -8);
            lVar29 = lVar19;
            if (lVar19 == lVar12) {
              lVar29 = lVar23;
            }
            if (lVar19 != 0) {
              lVar23 = lVar29;
            }
            lVar27 = lVar27 * 2;
          } while (lVar12 != 0);
        }
        lVar12 = lVar9;
        if (lVar23 == 0 && lVar9 == 0) {
          uVar20 = 2 << ((byte)uVar16 & 0x1f);
          uVar20 = (-uVar20 | uVar20) & uVar18;
          if (uVar20 == 0) goto LAB_0012bc59;
          uVar8 = 0;
          if (uVar20 != 0) {
            for (; (uVar20 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
            }
          }
          lVar23 = *(long *)((long)msp + (ulong)uVar8 * 8 + 0x248);
          lVar12 = 0;
        }
        while (lVar9 = lVar23, lVar23 != 0) {
LAB_0012bbf8:
          uVar26 = (*(ulong *)(lVar9 + 8) & 0xfffffffffffffffc) - uVar14;
          uVar16 = uVar26;
          if (uVar22 <= uVar26) {
            uVar16 = uVar22;
          }
          lVar23 = *(long *)(lVar9 + 0x20);
          if (uVar22 > uVar26) {
            lVar12 = lVar9;
          }
          uVar22 = uVar16;
          if (lVar23 == 0) {
            lVar23 = *(long *)(lVar9 + 0x28);
          }
        }
        if ((lVar12 != 0) && (uVar22 < *(long *)((long)msp + 8) - uVar14)) {
          lVar23 = *(long *)(lVar12 + 0x18);
          lVar9 = *(long *)(lVar12 + 0x30);
          if (lVar23 == lVar12) {
            if (*(long *)(lVar12 + 0x28) == 0) {
              if (*(long *)(lVar12 + 0x20) == 0) {
                lVar23 = 0;
                goto LAB_0012c1b3;
              }
              lVar27 = *(long *)(lVar12 + 0x20);
              puVar17 = (undefined8 *)(lVar12 + 0x20);
            }
            else {
              lVar27 = *(long *)(lVar12 + 0x28);
              puVar17 = (undefined8 *)(lVar12 + 0x28);
            }
            do {
              do {
                puVar28 = puVar17;
                lVar23 = lVar27;
                lVar27 = *(long *)(lVar23 + 0x28);
                puVar17 = (undefined8 *)(lVar23 + 0x28);
              } while (*(long *)(lVar23 + 0x28) != 0);
              lVar27 = *(long *)(lVar23 + 0x20);
              puVar17 = (undefined8 *)(lVar23 + 0x20);
            } while (*(long *)(lVar23 + 0x20) != 0);
            *puVar28 = 0;
          }
          else {
            lVar27 = *(long *)(lVar12 + 0x10);
            *(long *)(lVar27 + 0x18) = lVar23;
            *(long *)(lVar23 + 0x10) = lVar27;
          }
LAB_0012c1b3:
          if (lVar9 != 0) {
            lVar27 = *(long *)(lVar12 + 0x38);
            if (lVar12 == *(long *)((long)msp + lVar27 * 8 + 0x248)) {
              *(long *)((long)msp + lVar27 * 8 + 0x248) = lVar23;
              if (lVar23 != 0) goto LAB_0012c1ed;
              *(uint *)((long)msp + 4) = uVar18 & ~(1 << ((uint)lVar27 & 0x1f));
            }
            else {
              *(long *)(lVar9 + 0x20 + (ulong)(*(long *)(lVar9 + 0x20) != lVar12) * 8) = lVar23;
              if (lVar23 != 0) {
LAB_0012c1ed:
                *(long *)(lVar23 + 0x30) = lVar9;
                lVar9 = *(long *)(lVar12 + 0x20);
                if (lVar9 != 0) {
                  *(long *)(lVar23 + 0x20) = lVar9;
                  *(long *)(lVar9 + 0x30) = lVar23;
                }
                lVar9 = *(long *)(lVar12 + 0x28);
                if (lVar9 != 0) {
                  *(long *)(lVar23 + 0x28) = lVar9;
                  *(long *)(lVar9 + 0x30) = lVar23;
                }
              }
            }
          }
          if (uVar22 < 0x20) {
            *(ulong *)(lVar12 + 8) = uVar22 + uVar14 | 3;
            pbVar2 = (byte *)(lVar12 + 8 + uVar22 + uVar14);
            *pbVar2 = *pbVar2 | 1;
          }
          else {
            lVar23 = lVar12 + uVar14;
            *(ulong *)(lVar12 + 8) = uVar14 | 3;
            *(ulong *)(lVar12 + 8 + uVar14) = uVar22 | 1;
            *(ulong *)(lVar23 + uVar22) = uVar22;
            if (uVar22 < 0x100) {
              uVar22 = uVar22 >> 3;
              lVar9 = (long)msp + uVar22 * 0x10 + 0x38;
              if ((*msp >> ((uint)uVar22 & 0x1f) & 1) == 0) {
                *(uint *)msp = *msp | 1 << ((byte)uVar22 & 0x1f);
                lVar27 = lVar9;
              }
              else {
                lVar27 = *(long *)((long)msp + uVar22 * 0x10 + 0x48);
              }
              *(long *)((long)msp + uVar22 * 0x10 + 0x48) = lVar23;
              *(long *)(lVar27 + 0x18) = lVar23;
              *(long *)(lVar23 + 0x10) = lVar27;
              *(long *)(lVar23 + 0x18) = lVar9;
            }
            else {
              uVar18 = (uint)(uVar22 >> 8);
              if (uVar18 == 0) {
                uVar14 = 0;
              }
              else {
                uVar14 = 0x1f;
                if (uVar18 < 0x10000) {
                  uVar20 = 0x1f;
                  if (uVar18 != 0) {
                    for (; uVar18 >> uVar20 == 0; uVar20 = uVar20 - 1) {
                    }
                  }
                  uVar14 = (ulong)((uint)((uVar22 >> ((ulong)(byte)(0x26 - (char)(uVar20 ^ 0x1f)) &
                                                     0x3f) & 1) != 0) | (uVar20 ^ 0x1f) * 2 ^ 0x3e);
                }
              }
              plVar24 = (long *)((long)msp + uVar14 * 8 + 0x248);
              *(ulong *)(lVar23 + 0x38) = uVar14;
              *(undefined1 (*) [16])(lVar23 + 0x20) = (undefined1  [16])0x0;
              if ((*(uint *)((long)msp + 4) >> ((uint)uVar14 & 0x1f) & 1) == 0) {
                *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << ((byte)uVar14 & 0x1f);
                *plVar24 = lVar23;
                *(long **)(lVar23 + 0x30) = plVar24;
              }
              else {
                bVar25 = 0x39 - (char)(uVar14 >> 1);
                if (uVar14 == 0x1f) {
                  bVar25 = 0;
                }
                lVar27 = uVar22 << (bVar25 & 0x3f);
                lVar9 = *plVar24;
                do {
                  lVar19 = lVar9;
                  if ((*(ulong *)(lVar19 + 8) & 0xfffffffffffffffc) == uVar22) {
                    lVar9 = *(long *)(lVar19 + 0x10);
                    *(long *)(lVar9 + 0x18) = lVar23;
                    *(long *)(lVar19 + 0x10) = lVar23;
                    *(long *)(lVar23 + 0x10) = lVar9;
                    *(long *)(lVar23 + 0x18) = lVar19;
                    *(undefined8 *)(lVar23 + 0x30) = 0;
                    goto LAB_0012bd42;
                  }
                  lVar29 = lVar27 >> 0x3f;
                  lVar27 = lVar27 * 2;
                  lVar9 = *(long *)(lVar19 + 0x20 + lVar29 * -8);
                } while (lVar9 != 0);
                *(long *)(lVar19 + 0x20 + lVar29 * -8) = lVar23;
                *(long *)(lVar23 + 0x30) = lVar19;
              }
              *(long *)(lVar23 + 0x18) = lVar23;
              *(long *)(lVar23 + 0x10) = lVar23;
            }
          }
          goto LAB_0012bd42;
        }
      }
    }
  }
LAB_0012bc59:
  uVar16 = *(ulong *)((long)msp + 8);
  uVar22 = uVar16 - uVar14;
  if (uVar14 <= uVar16) {
    lVar12 = *(long *)((long)msp + 0x18);
    if (uVar22 < 0x20) {
      *(ulong *)(lVar12 + 8) = uVar16 | 3;
      pbVar2 = (byte *)(lVar12 + 8 + uVar16);
      *pbVar2 = *pbVar2 | 1;
      lVar23 = 0;
      uVar22 = 0;
    }
    else {
      lVar23 = lVar12 + uVar14;
      *(ulong *)(lVar12 + 8 + uVar14) = uVar22 | 1;
      *(ulong *)(lVar12 + uVar16) = uVar22;
      *(ulong *)(lVar12 + 8) = uVar14 | 3;
    }
    *(long *)((long)msp + 0x18) = lVar23;
    *(ulong *)((long)msp + 8) = uVar22;
    goto LAB_0012bd42;
  }
  uVar16 = *(ulong *)((long)msp + 0x10) - uVar14;
  if (*(ulong *)((long)msp + 0x10) < uVar14 || uVar16 == 0) {
    if ((0x1ffff < uVar14) && (pvVar10 = direct_alloc(uVar14), pvVar10 != (void *)0x0)) {
      return pvVar10;
    }
    uVar16 = uVar14 + 0x20040 & 0xfffffffffffe0000;
    if (uVar16 <= uVar14) {
      return (void *)0x0;
    }
    pvVar10 = mmap_map32(uVar16);
    if (pvVar10 == (void *)0xffffffffffffffff) {
      return (void *)0x0;
    }
    puVar1 = (ulong *)((long)msp + 0x348);
    puVar21 = puVar1;
    do {
      if (pvVar10 == (void *)((long)*puVar21 + puVar21[1])) {
        pvVar3 = *(void **)((long)msp + 0x20);
        if (((void *)*puVar21 <= pvVar3) && (pvVar3 < pvVar10)) {
          puVar21[1] = puVar21[1] + uVar16;
          lVar12 = uVar16 + *(long *)((long)msp + 0x10);
          uVar16 = (ulong)(-(int)pvVar3 - 0x10U & 7);
          uVar22 = lVar12 - uVar16;
          *(ulong *)((long)msp + 0x20) = (long)pvVar3 + uVar16;
          *(ulong *)((long)msp + 0x10) = uVar22;
          *(ulong *)((long)pvVar3 + uVar16 + 8) = uVar22 | 1;
          *(undefined8 *)((long)pvVar3 + lVar12 + 8) = 0x40;
          *(undefined8 *)((long)msp + 0x28) = 0x200000;
          goto LAB_0012c4ab;
        }
        break;
      }
      puVar21 = (ulong *)puVar21[2];
    } while (puVar21 != (ulong *)0x0);
    puVar21 = puVar1;
    while( true ) {
      uVar22 = *puVar21;
      if (uVar22 == (long)pvVar10 + uVar16) break;
      puVar21 = (ulong *)puVar21[2];
      if (puVar21 == (ulong *)0x0) goto code_r0x0012bdbe;
    }
    *puVar21 = (ulong)pvVar10;
    puVar21[1] = puVar21[1] + uVar16;
    uVar26 = (ulong)(-(int)pvVar10 - 0x10U & 7);
    lVar23 = (-(int)uVar22 - 0x10U & 7) + uVar22;
    lVar12 = (long)pvVar10 + uVar14 + uVar26;
    uVar16 = lVar23 - lVar12;
    *(ulong *)((long)pvVar10 + uVar26 + 8) = uVar14 | 3;
    if (lVar23 == *(long *)((long)msp + 0x20)) {
      uVar16 = uVar16 + *(long *)((long)msp + 0x10);
      *(ulong *)((long)msp + 0x10) = uVar16;
      *(long *)((long)msp + 0x20) = lVar12;
      *(ulong *)(lVar12 + 8) = uVar16 | 1;
      goto LAB_0012c82a;
    }
    if (lVar23 == *(long *)((long)msp + 0x18)) {
      uVar16 = uVar16 + *(long *)((long)msp + 8);
      *(ulong *)((long)msp + 8) = uVar16;
      *(long *)((long)msp + 0x18) = lVar12;
      *(ulong *)(lVar12 + 8) = uVar16 | 1;
      *(ulong *)(lVar12 + uVar16) = uVar16;
      goto LAB_0012c82a;
    }
    uVar14 = *(ulong *)(lVar23 + 8);
    if ((uVar14 & 2) != 0) goto LAB_0012c6d0;
    uVar22 = uVar14 & 0xfffffffffffffffc;
    lVar9 = *(long *)(lVar23 + 0x18);
    if (uVar14 < 0x100) {
      lVar27 = *(long *)(lVar23 + 0x10);
      if (lVar27 == lVar9) {
        bVar25 = (byte)(uVar14 >> 3) & 0x1f;
        *(uint *)msp = *msp & (-2 << bVar25 | 0xfffffffeU >> 0x20 - bVar25);
      }
      else {
        *(long *)(lVar27 + 0x18) = lVar9;
        *(long *)(lVar9 + 0x10) = lVar27;
      }
      goto LAB_0012c6c5;
    }
    lVar27 = *(long *)(lVar23 + 0x30);
    if (lVar9 != lVar23) {
      lVar19 = *(long *)(lVar23 + 0x10);
      *(long *)(lVar19 + 0x18) = lVar9;
      *(long *)(lVar9 + 0x10) = lVar19;
      goto LAB_0012c65b;
    }
    if (*(long *)(lVar23 + 0x28) != 0) {
      lVar19 = *(long *)(lVar23 + 0x28);
      puVar17 = (undefined8 *)(lVar23 + 0x28);
      goto LAB_0012c634;
    }
    if (*(long *)(lVar23 + 0x20) == 0) {
      lVar9 = 0;
    }
    else {
      lVar19 = *(long *)(lVar23 + 0x20);
      puVar17 = (undefined8 *)(lVar23 + 0x20);
LAB_0012c634:
      do {
        do {
          puVar28 = puVar17;
          lVar9 = lVar19;
          lVar19 = *(long *)(lVar9 + 0x28);
          puVar17 = (undefined8 *)(lVar9 + 0x28);
        } while (*(long *)(lVar9 + 0x28) != 0);
        lVar19 = *(long *)(lVar9 + 0x20);
        puVar17 = (undefined8 *)(lVar9 + 0x20);
      } while (*(long *)(lVar9 + 0x20) != 0);
      *puVar28 = 0;
    }
LAB_0012c65b:
    if (lVar27 != 0) {
      lVar19 = *(long *)(lVar23 + 0x38);
      if (lVar23 == *(long *)((long)msp + lVar19 * 8 + 0x248)) {
        *(long *)((long)msp + lVar19 * 8 + 0x248) = lVar9;
        if (lVar9 == 0) {
          bVar25 = (byte)lVar19 & 0x1f;
          *(uint *)((long)msp + 4) =
               *(uint *)((long)msp + 4) & (-2 << bVar25 | 0xfffffffeU >> 0x20 - bVar25);
          goto LAB_0012c6c5;
        }
      }
      else {
        *(long *)(lVar27 + 0x20 + (ulong)(*(long *)(lVar27 + 0x20) != lVar23) * 8) = lVar9;
        if (lVar9 == 0) goto LAB_0012c6c5;
      }
      *(long *)(lVar9 + 0x30) = lVar27;
      lVar27 = *(long *)(lVar23 + 0x20);
      if (lVar27 != 0) {
        *(long *)(lVar9 + 0x20) = lVar27;
        *(long *)(lVar27 + 0x30) = lVar9;
      }
      lVar27 = *(long *)(lVar23 + 0x28);
      if (lVar27 != 0) {
        *(long *)(lVar9 + 0x28) = lVar27;
        *(long *)(lVar27 + 0x30) = lVar9;
      }
    }
LAB_0012c6c5:
    uVar14 = *(ulong *)(lVar23 + 8 + uVar22);
    lVar23 = lVar23 + uVar22;
    uVar16 = uVar16 + uVar22;
LAB_0012c6d0:
    *(ulong *)(lVar23 + 8) = uVar14 & 0xfffffffffffffffe;
    *(ulong *)(lVar12 + 8) = uVar16 | 1;
    *(ulong *)(lVar12 + uVar16) = uVar16;
    if (uVar16 < 0x100) {
      uVar16 = uVar16 >> 3;
      lVar23 = (long)msp + uVar16 * 0x10 + 0x38;
      if ((*msp >> ((uint)uVar16 & 0x1f) & 1) == 0) {
        *(uint *)msp = *msp | 1 << ((byte)uVar16 & 0x1f);
        lVar9 = lVar23;
      }
      else {
        lVar9 = *(long *)((long)msp + uVar16 * 0x10 + 0x48);
      }
      *(long *)((long)msp + uVar16 * 0x10 + 0x48) = lVar12;
      *(long *)(lVar9 + 0x18) = lVar12;
      *(long *)(lVar12 + 0x10) = lVar9;
      *(long *)(lVar12 + 0x18) = lVar23;
    }
    else {
      uVar18 = (uint)(uVar16 >> 8);
      if (uVar18 == 0) {
        uVar14 = 0;
      }
      else {
        uVar14 = 0x1f;
        if (uVar18 < 0x10000) {
          uVar20 = 0x1f;
          if (uVar18 != 0) {
            for (; uVar18 >> uVar20 == 0; uVar20 = uVar20 - 1) {
            }
          }
          uVar14 = (ulong)((uint)((uVar16 >> ((ulong)(byte)(0x26 - (char)(uVar20 ^ 0x1f)) & 0x3f) &
                                  1) != 0) | (uVar20 ^ 0x1f) * 2 ^ 0x3e);
        }
      }
      plVar24 = (long *)((long)msp + uVar14 * 8 + 0x248);
      *(ulong *)(lVar12 + 0x38) = uVar14;
      *(undefined1 (*) [16])(lVar12 + 0x20) = (undefined1  [16])0x0;
      if ((*(uint *)((long)msp + 4) >> ((uint)uVar14 & 0x1f) & 1) == 0) {
        *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << ((byte)uVar14 & 0x1f);
        *plVar24 = lVar12;
        *(long **)(lVar12 + 0x30) = plVar24;
      }
      else {
        bVar25 = 0x39 - (char)(uVar14 >> 1);
        if (uVar14 == 0x1f) {
          bVar25 = 0;
        }
        lVar9 = uVar16 << (bVar25 & 0x3f);
        lVar23 = *plVar24;
        do {
          lVar27 = lVar23;
          if ((*(ulong *)(lVar27 + 8) & 0xfffffffffffffffc) == uVar16) {
            lVar23 = *(long *)(lVar27 + 0x10);
            *(long *)(lVar23 + 0x18) = lVar12;
            *(long *)(lVar27 + 0x10) = lVar12;
            *(long *)(lVar12 + 0x10) = lVar23;
            *(long *)(lVar12 + 0x18) = lVar27;
            *(undefined8 *)(lVar12 + 0x30) = 0;
            goto LAB_0012c82a;
          }
          lVar19 = lVar9 >> 0x3f;
          lVar9 = lVar9 * 2;
          lVar23 = *(long *)(lVar27 + 0x20 + lVar19 * -8);
        } while (lVar23 != 0);
        *(long *)(lVar27 + 0x20 + lVar19 * -8) = lVar12;
        *(long *)(lVar12 + 0x30) = lVar27;
      }
      *(long *)(lVar12 + 0x18) = lVar12;
      *(long *)(lVar12 + 0x10) = lVar12;
    }
LAB_0012c82a:
    return (void *)((long)pvVar10 + uVar26 + 0x10);
  }
  goto LAB_0012bc6e;
code_r0x0012bdbe:
  pauVar4 = *(undefined1 (**) [16])((long)msp + 0x20);
  for (puVar21 = puVar1;
      (pauVar4 < (undefined1 (*) [16])*puVar21 ||
      (pauVar15 = (undefined1 (*) [16])(*(undefined1 (*) [16])*puVar21 + puVar21[1]),
      pauVar15 <= pauVar4)); puVar21 = (ulong *)puVar21[2]) {
  }
  pauVar13 = (undefined1 (*) [16])(pauVar15[-5] + (ulong)(0x37U - (int)pauVar15 & 7) + 9);
  if ((undefined1 (*) [16])(pauVar15[-5] + (ulong)(0x37U - (int)pauVar15 & 7) + 9) < pauVar4 + 2) {
    pauVar13 = pauVar4;
  }
  uVar26 = (ulong)(-(int)pvVar10 - 0x10U & 7);
  uVar22 = (uVar16 - 0x40) - uVar26;
  *(ulong *)((long)msp + 0x20) = (long)pvVar10 + uVar26;
  *(ulong *)((long)msp + 0x10) = uVar22;
  *(ulong *)((long)pvVar10 + uVar26 + 8) = uVar22 | 1;
  *(undefined8 *)((long)pvVar10 + (uVar16 - 0x38)) = 0x40;
  *(undefined8 *)((long)msp + 0x28) = 0x200000;
  *(undefined8 *)(*pauVar13 + 8) = 0x23;
  uVar5 = *(undefined8 *)((long)msp + 0x350);
  *(ulong *)pauVar13[1] = *puVar1;
  *(undefined8 *)(pauVar13[1] + 8) = uVar5;
  *(undefined8 *)pauVar13[2] = *(undefined8 *)((long)msp + 0x358);
  *(void **)((long)msp + 0x348) = pvVar10;
  *(ulong *)((long)msp + 0x350) = uVar16;
  *(undefined1 (**) [16])((long)msp + 0x358) = pauVar13 + 1;
  auVar7 = _DAT_0015d640;
  auVar6 = _DAT_0015d630;
  pauVar11 = pauVar13 + 3;
  if (pauVar13 + 3 < pauVar15) {
    pauVar11 = pauVar15;
  }
  uVar16 = (long)pauVar11 + (-0x29 - (long)pauVar13);
  auVar32._8_4_ = (int)uVar16;
  auVar32._0_8_ = uVar16;
  auVar32._12_4_ = (int)(uVar16 >> 0x20);
  auVar30._0_8_ = uVar16 >> 3;
  auVar30._8_8_ = auVar32._8_8_ >> 3;
  uVar22 = 0;
  auVar30 = auVar30 ^ _DAT_0015d640;
  do {
    auVar31._8_4_ = (int)uVar22;
    auVar31._0_8_ = uVar22;
    auVar31._12_4_ = (int)(uVar22 >> 0x20);
    auVar32 = (auVar31 | auVar6) ^ auVar7;
    if ((bool)(~(auVar32._4_4_ == auVar30._4_4_ && auVar30._0_4_ < auVar32._0_4_ ||
                auVar30._4_4_ < auVar32._4_4_) & 1)) {
      *(undefined8 *)(pauVar13[2] + uVar22 * 8 + 8) = 0xb;
    }
    if ((auVar32._12_4_ != auVar30._12_4_ || auVar32._8_4_ <= auVar30._8_4_) &&
        auVar32._12_4_ <= auVar30._12_4_) {
      *(undefined8 *)(pauVar13[3] + uVar22 * 8) = 0xb;
    }
    uVar22 = uVar22 + 2;
  } while (((uVar16 >> 3) + 2 & 0xfffffffffffffffe) != uVar22);
  uVar16 = (long)pauVar13 - (long)pauVar4;
  if (uVar16 != 0) {
    (*pauVar13)[8] = (*pauVar13)[8] & 0xfe;
    *(ulong *)(*pauVar4 + 8) = uVar16 | 1;
    *(ulong *)*pauVar13 = uVar16;
    if (uVar16 < 0x100) {
      uVar16 = uVar16 >> 3;
      pauVar15 = (undefined1 (*) [16])((long)msp + uVar16 * 0x10 + 0x38);
      if ((*msp >> ((uint)uVar16 & 0x1f) & 1) == 0) {
        *(uint *)msp = *msp | 1 << ((byte)uVar16 & 0x1f);
        pauVar13 = pauVar15;
      }
      else {
        pauVar13 = *(undefined1 (**) [16])((long)msp + uVar16 * 0x10 + 0x48);
      }
      *(undefined1 (**) [16])((long)msp + uVar16 * 0x10 + 0x48) = pauVar4;
      *(undefined1 (**) [16])(pauVar13[1] + 8) = pauVar4;
      lVar12 = 0x18;
      lVar23 = 0x10;
    }
    else {
      uVar18 = (uint)(uVar16 >> 8);
      if (uVar18 == 0) {
        uVar22 = 0;
      }
      else {
        uVar22 = 0x1f;
        if (uVar18 < 0x10000) {
          uVar20 = 0x1f;
          if (uVar18 != 0) {
            for (; uVar18 >> uVar20 == 0; uVar20 = uVar20 - 1) {
            }
          }
          uVar22 = (ulong)((uint)((uVar16 >> ((ulong)(byte)(0x26 - (char)(uVar20 ^ 0x1f)) & 0x3f) &
                                  1) != 0) | (uVar20 ^ 0x1f) * 2 ^ 0x3e);
        }
      }
      puVar17 = (undefined8 *)((long)msp + uVar22 * 8 + 0x248);
      *(ulong *)(pauVar4[3] + 8) = uVar22;
      pauVar4[2] = (undefined1  [16])0x0;
      if ((*(uint *)((long)msp + 4) >> ((uint)uVar22 & 0x1f) & 1) == 0) {
        *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << ((byte)uVar22 & 0x1f);
        *puVar17 = pauVar4;
        *(undefined8 **)pauVar4[3] = puVar17;
      }
      else {
        bVar25 = 0x39 - (char)(uVar22 >> 1);
        if (uVar22 == 0x1f) {
          bVar25 = 0;
        }
        lVar12 = uVar16 << (bVar25 & 0x3f);
        pauVar15 = (undefined1 (*) [16])*puVar17;
        do {
          pauVar13 = pauVar15;
          if ((*(ulong *)(*pauVar13 + 8) & 0xfffffffffffffffc) == uVar16) {
            lVar12 = *(long *)pauVar13[1];
            *(undefined1 (**) [16])(lVar12 + 0x18) = pauVar4;
            *(undefined1 (**) [16])pauVar13[1] = pauVar4;
            *(long *)pauVar4[1] = lVar12;
            lVar12 = 0x30;
            lVar23 = 0x18;
            pauVar15 = (undefined1 (*) [16])0x0;
            goto LAB_0012c4a3;
          }
          lVar23 = lVar12 >> 0x3f;
          lVar12 = lVar12 * 2;
          pauVar15 = *(undefined1 (**) [16])((long)pauVar13 + lVar23 * -8 + 0x20);
        } while (pauVar15 != (undefined1 (*) [16])0x0);
        *(undefined1 (**) [16])((long)pauVar13 + lVar23 * -8 + 0x20) = pauVar4;
        *(undefined1 (**) [16])pauVar4[3] = pauVar13;
      }
      lVar12 = 0x10;
      lVar23 = 0x18;
      pauVar13 = pauVar4;
      pauVar15 = pauVar4;
    }
LAB_0012c4a3:
    *(undefined1 (**) [16])(*pauVar4 + lVar23) = pauVar13;
    *(undefined1 (**) [16])(*pauVar4 + lVar12) = pauVar15;
  }
LAB_0012c4ab:
  uVar16 = *(ulong *)((long)msp + 0x10) - uVar14;
  if (*(ulong *)((long)msp + 0x10) < uVar14 || uVar16 == 0) {
    return (void *)0x0;
  }
LAB_0012bc6e:
  *(ulong *)((long)msp + 0x10) = uVar16;
  lVar12 = *(long *)((long)msp + 0x20);
  *(ulong *)((long)msp + 0x20) = lVar12 + uVar14;
  *(ulong *)(lVar12 + 8 + uVar14) = uVar16 | 1;
  *(ulong *)(lVar12 + 8) = uVar14 | 3;
LAB_0012bd42:
  return (void *)(lVar12 + 0x10);
}

Assistant:

static LJ_NOINLINE void *lj_alloc_malloc(void *msp, size_t nsize)
{
  mstate ms = (mstate)msp;
  void *mem;
  size_t nb;
  if (nsize <= MAX_SMALL_REQUEST) {
    bindex_t idx;
    binmap_t smallbits;
    nb = (nsize < MIN_REQUEST)? MIN_CHUNK_SIZE : pad_request(nsize);
    idx = small_index(nb);
    smallbits = ms->smallmap >> idx;

    if ((smallbits & 0x3U) != 0) { /* Remainderless fit to a smallbin. */
      mchunkptr b, p;
      idx += ~smallbits & 1;       /* Uses next bin if idx empty */
      b = smallbin_at(ms, idx);
      p = b->fd;
      unlink_first_small_chunk(ms, b, p, idx);
      set_inuse_and_pinuse(ms, p, small_index2size(idx));
      mem = chunk2mem(p);
      return mem;
    } else if (nb > ms->dvsize) {
      if (smallbits != 0) { /* Use chunk in next nonempty smallbin */
	mchunkptr b, p, r;
	size_t rsize;
	binmap_t leftbits = (smallbits << idx) & left_bits(idx2bit(idx));
	bindex_t i = lj_ffs(leftbits);
	b = smallbin_at(ms, i);
	p = b->fd;
	unlink_first_small_chunk(ms, b, p, i);
	rsize = small_index2size(i) - nb;
	/* Fit here cannot be remainderless if 4byte sizes */
	if (SIZE_T_SIZE != 4 && rsize < MIN_CHUNK_SIZE) {
	  set_inuse_and_pinuse(ms, p, small_index2size(i));
	} else {
	  set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
	  r = chunk_plus_offset(p, nb);
	  set_size_and_pinuse_of_free_chunk(r, rsize);
	  replace_dv(ms, r, rsize);
	}
	mem = chunk2mem(p);
	return mem;
      } else if (ms->treemap != 0 && (mem = tmalloc_small(ms, nb)) != 0) {
	return mem;
      }
    }
  } else if (nsize >= MAX_REQUEST) {
    nb = MAX_SIZE_T; /* Too big to allocate. Force failure (in sys alloc) */
  } else {
    nb = pad_request(nsize);
    if (ms->treemap != 0 && (mem = tmalloc_large(ms, nb)) != 0) {
      return mem;
    }
  }

  if (nb <= ms->dvsize) {
    size_t rsize = ms->dvsize - nb;
    mchunkptr p = ms->dv;
    if (rsize >= MIN_CHUNK_SIZE) { /* split dv */
      mchunkptr r = ms->dv = chunk_plus_offset(p, nb);
      ms->dvsize = rsize;
      set_size_and_pinuse_of_free_chunk(r, rsize);
      set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
    } else { /* exhaust dv */
      size_t dvs = ms->dvsize;
      ms->dvsize = 0;
      ms->dv = 0;
      set_inuse_and_pinuse(ms, p, dvs);
    }
    mem = chunk2mem(p);
    return mem;
  } else if (nb < ms->topsize) { /* Split top */
    size_t rsize = ms->topsize -= nb;
    mchunkptr p = ms->top;
    mchunkptr r = ms->top = chunk_plus_offset(p, nb);
    r->head = rsize | PINUSE_BIT;
    set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
    mem = chunk2mem(p);
    return mem;
  }
  return alloc_sys(ms, nb);
}